

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O2

void bool_rel(BoolView *x,BoolRelType t,BoolView *y,BoolView *z)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  BoolRelType BVar4;
  uint uVar5;
  long lVar6;
  int m;
  uint uVar7;
  BoolRelType BVar8;
  BoolView *this;
  BoolRelType BVar9;
  uint uVar10;
  Lit local_7c;
  vec<Lit> local_78;
  BoolView v [3];
  
  v[0].super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  v[0].v = x->v;
  v[0].s = x->s;
  v[1].super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  v[1].v = y->v;
  v[1].s = y->s;
  v[2].super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
  v[2].v = z->v;
  v[2].s = z->s;
  uVar5 = 1;
  BVar8 = 0;
  do {
    if (uVar5 == 4) {
      return;
    }
    for (uVar10 = 0; uVar2 = uVar5, uVar3 = uVar10, uVar10 != 8; uVar10 = uVar10 + 1) {
      for (; uVar3 != 0; uVar3 = uVar3 - 1 & uVar3) {
        uVar2 = uVar2 - 1;
      }
      if (uVar2 == 0) {
        for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
          if ((uVar2 & ~uVar10) == 0) {
            BVar9 = 0;
            for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
              bVar1 = true;
              for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
                bVar1 = (bool)(bVar1 & (((uVar3 ^ uVar2) >> (uVar7 & 0x1f) & 1) != 0 ||
                                       (uVar10 >> (uVar7 & 0x1f) & 1) == 0));
              }
              BVar4 = 1 << ((byte)uVar3 & 0x1f);
              if (!bVar1) {
                BVar4 = 0;
              }
              BVar9 = BVar9 | BVar4;
            }
            if (((BVar9 & t) == 0) && ((BVar9 & ~BVar8) != 0)) {
              local_78.sz = 0;
              local_78.cap = 0;
              local_78.data = (Lit *)0x0;
              this = v;
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                uVar3 = 1 << ((byte)lVar6 & 0x1f);
                if ((uVar10 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
                  if (((uVar5 == 1) &&
                      (bVar1 = BoolView::setValNotR(this,(uVar3 & uVar2) != 0), bVar1)) &&
                     (bVar1 = BoolView::setVal(this,(uVar3 & uVar2) != 0,(Reason)0x0), !bVar1)) {
                    puts("=====UNSATISFIABLE=====");
                    printf("%% Top level failure!\n");
                    exit(0);
                  }
                  local_7c.x = (uint)(this->s == ((uVar3 & uVar2) != 0)) + this->v * 2;
                  vec<Lit>::push(&local_78,&local_7c);
                }
                this = this + 1;
              }
              if (1 < uVar5) {
                SAT::addClause(&sat,&local_78,false);
              }
              BVar8 = BVar8 | BVar9;
              free(local_78.data);
            }
          }
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void bool_rel(BoolView x, BoolRelType t, BoolView y, BoolView z) {
	//	NOT_SUPPORTED;
	const BoolView v[3] = {std::move(x), std::move(y), std::move(z)};
	int u = 0;

	for (int l = 1; l <= 3; l++) {
		for (int i = 0; i < 8; i++) {
			if (bitcount<int>(i) != l) {
				continue;
			}
			for (int j = 0; j < 8; j++) {
				if ((j & ~i) != 0) {
					continue;
				}
				int flags = 0;
				for (int k = 0; k < 8; k++) {
					bool pass = true;
					for (int m = 0; m < 3; m++) {
						if ((i & (1 << m)) == 0) {
							continue;
						}
						if (((k ^ j) & (1 << m)) == 0) {
							pass = false;
						}
					}
					if (pass) {
						flags |= (1 << k);
					}
				}
				if ((t & flags) != 0) {
					continue;
				}
				if ((flags & ~u) == 0) {
					continue;
				}
				vec<Lit> ps;
				for (int m = 0; m < 3; m++) {
					if ((i & (1 << m)) == 0) {
						continue;
					}
					const bool p = ((j >> m) & 1) != 0;
					if (l == 1) {
						if (v[m].setValNotR(p)) {
							if (!v[m].setVal(p)) {
								TL_FAIL();
							}
						}
					}
					ps.push(v[m].getLit(p));
				}
				if (l >= 2) {
					sat.addClause(ps);
				}
				u |= flags;
			}
		}
	}
}